

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O1

void __thiscall
helics::TimeoutMonitor::pingReply(TimeoutMonitor *this,ActionMessage *cmd,CoreBroker *brk)

{
  int iVar1;
  pointer plVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  pointer plVar6;
  ActionMessage noforward;
  ActionMessage local_d0;
  
  iVar1 = (cmd->source_id).gid;
  if (iVar1 == (this->parentConnection).connection.gid) {
    (this->parentConnection).waitingForPingReply = false;
    this->waitingForConnection = false;
  }
  else {
    plVar6 = (this->connections).
             super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar2 = (this->connections).
             super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (plVar6 == plVar2) {
      bVar5 = true;
      bVar3 = 0;
    }
    else {
      bVar4 = 0;
      bVar3 = 0;
      do {
        if (iVar1 == (plVar6->connection).gid) {
          bVar3 = plVar6->waitingForPingReply;
          plVar6->waitingForPingReply = false;
        }
        if (plVar6->waitingForPingReply != false) {
          bVar4 = 1;
        }
        plVar6 = plVar6 + 1;
      } while (plVar6 != plVar2);
      bVar5 = (bool)(bVar4 ^ 1);
    }
    if (((bVar5) && (brk != (CoreBroker *)0x0)) && ((bVar3 & 1) != 0)) {
      ActionMessage::ActionMessage(&local_d0,cmd_broker_configure);
      local_d0.source_id.gid = (cmd->dest_id).gid;
      local_d0.messageID = 0x25f;
      local_d0.dest_id.gid = local_d0.source_id.gid;
      BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_d0);
      ActionMessage::~ActionMessage(&local_d0);
    }
  }
  return;
}

Assistant:

void TimeoutMonitor::pingReply(const ActionMessage& cmd, CoreBroker* brk)
{
    if (cmd.source_id == GlobalFederateId(parentConnection.connection)) {
        parentConnection.waitingForPingReply = false;
        waitingForConnection = false;
    } else {
        bool waiting{false};
        bool waswaiting{false};
        for (auto& conn : connections) {
            if (cmd.source_id == GlobalFederateId(conn.connection)) {
                waswaiting = conn.waitingForPingReply;
                conn.waitingForPingReply = false;
            }
            if (conn.waitingForPingReply) {
                waiting = true;
            }
        }
        if (!waiting && waswaiting) {
            if (brk != nullptr) {
                ActionMessage noforward(CMD_BROKER_CONFIGURE);
                noforward.dest_id = cmd.dest_id;
                noforward.source_id = cmd.dest_id;
                noforward.messageID = REQUEST_TICK_FORWARDING;
                brk->addActionMessage(noforward);
            }
        }
    }
}